

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HaveWellDefinedOutputFiles(cmGeneratorTarget *this)

{
  TargetType TVar1;
  undefined1 local_11;
  cmGeneratorTarget *this_local;
  
  TVar1 = GetType(this);
  local_11 = true;
  if (TVar1 != STATIC_LIBRARY) {
    TVar1 = GetType(this);
    local_11 = true;
    if (TVar1 != SHARED_LIBRARY) {
      TVar1 = GetType(this);
      local_11 = true;
      if (TVar1 != MODULE_LIBRARY) {
        TVar1 = GetType(this);
        local_11 = true;
        if (TVar1 != OBJECT_LIBRARY) {
          TVar1 = GetType(this);
          local_11 = TVar1 == EXECUTABLE;
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool cmGeneratorTarget::HaveWellDefinedOutputFiles() const
{
  return this->GetType() == cmStateEnums::STATIC_LIBRARY ||
    this->GetType() == cmStateEnums::SHARED_LIBRARY ||
    this->GetType() == cmStateEnums::MODULE_LIBRARY ||
    this->GetType() == cmStateEnums::OBJECT_LIBRARY ||
    this->GetType() == cmStateEnums::EXECUTABLE;
}